

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void ldamath::vexpdigammify_2(vw *all,float *gamma,float *norm,float underflow_threshold)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  float *fp;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar12;
  float fVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar14;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar18;
  undefined1 auVar17 [16];
  float fVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar21 [16];
  
  pauVar2 = (undefined1 (*) [16])(gamma + all->lda);
  pauVar3 = (undefined1 (*) [16])gamma;
  if (((ulong)gamma & 0xf) != 0 && (ulong)all->lda != 0) {
    do {
      fVar8 = *(float *)*pauVar3;
      fVar13 = fVar8 + 2.0;
      fVar12 = (float)((uint)fVar13 & 0x7fffff | 0x3f000000);
      auVar6._4_12_ = DAT_002814b0._4_12_;
      auVar6._0_4_ = fVar8 * 6.0 + 13.0;
      auVar10._0_4_ = fVar13 * 12.0 * fVar13;
      auVar10._4_4_ = fVar12 + 0.35208872;
      auVar10._8_8_ = 0;
      auVar6 = divps(auVar6,auVar10);
      fVar12 = ((((fVar12 * -1.4980303 + (float)(uint)fVar13 * 1.1920929e-07 + -124.22545) -
                 auVar6._4_4_) * 0.6931472 +
                (-(fVar8 + fVar8 + 1.0) / ((fVar8 + 1.0) * fVar8) - auVar6._0_4_)) - *norm) *
               1.442695;
      fVar8 = -126.0;
      if (-126.0 <= fVar12) {
        fVar8 = fVar12;
      }
      fVar12 = (fVar8 - (float)(int)fVar8) + (float)(-(uint)(fVar12 < 0.0) & 0x3f800000);
      fVar12 = (float)(long)((fVar12 * -1.4901291 +
                             27.728024 / (4.8425255 - fVar12) + fVar8 + 121.274086) * 8388608.0);
      fVar8 = fVar12;
      if (fVar12 <= underflow_threshold) {
        fVar8 = underflow_threshold;
      }
      *(uint *)*pauVar3 =
           ~-(uint)NAN(underflow_threshold) & (uint)fVar8 |
           -(uint)NAN(underflow_threshold) & (uint)fVar12;
      pauVar3 = (undefined1 (*) [16])((long)*pauVar3 + 4);
      norm = norm + 1;
      gamma = gamma + 1;
    } while ((pauVar3 < pauVar2) && (((ulong)gamma & 0xf) != 0));
  }
  auVar6 = _DAT_002815f0;
  pauVar1 = pauVar3;
  if (pauVar3 + 1 < pauVar2 && ((ulong)gamma & 0xf) == 0) {
    do {
      fVar8 = *(float *)*pauVar3;
      fVar12 = *(float *)((long)*pauVar3 + 4);
      fVar13 = *(float *)((long)*pauVar3 + 8);
      fVar14 = *(float *)((long)*pauVar3 + 0xc);
      fVar20 = fVar8 + 2.0;
      fVar22 = fVar12 + 2.0;
      fVar23 = fVar13 + 2.0;
      fVar25 = fVar14 + 2.0;
      auVar15._0_4_ = (fVar8 + 1.0) * fVar8 * 12.0 * fVar20 * fVar20;
      auVar15._4_4_ = (fVar12 + 1.0) * fVar12 * 12.0 * fVar22 * fVar22;
      auVar15._8_4_ = (fVar13 + 1.0) * fVar13 * 12.0 * fVar23 * fVar23;
      auVar15._12_4_ = (fVar14 + 1.0) * fVar14 * 12.0 * fVar25 * fVar25;
      fVar18 = (float)((uint)fVar20 & 0x7fffff | 0x3f000000);
      fVar19 = (float)((uint)fVar22 & 0x7fffff | 0x3f000000);
      fVar24 = (float)((uint)fVar23 & 0x7fffff | 0x3f000000);
      fVar26 = (float)((uint)fVar25 & 0x7fffff | 0x3f000000);
      auVar21._0_4_ = fVar18 + 0.35208872;
      auVar21._4_4_ = fVar19 + 0.35208872;
      auVar21._8_4_ = fVar24 + 0.35208872;
      auVar21._12_4_ = fVar26 + 0.35208872;
      auVar17 = divps(_DAT_00281530,auVar21);
      auVar9._0_4_ = ((fVar8 * -30.0 + -127.0) * fVar8 + -157.0) * fVar8 + -48.0;
      auVar9._4_4_ = ((fVar12 * -30.0 + -127.0) * fVar12 + -157.0) * fVar12 + -48.0;
      auVar9._8_4_ = ((fVar13 * -30.0 + -127.0) * fVar13 + -157.0) * fVar13 + -48.0;
      auVar9._12_4_ = ((fVar14 * -30.0 + -127.0) * fVar14 + -157.0) * fVar14 + -48.0;
      auVar10 = divps(auVar9,auVar15);
      fVar8 = ((auVar10._0_4_ +
               (auVar17._0_4_ +
               fVar18 * -1.4980303 + (float)(int)fVar20 * 1.1920929e-07 + -124.22552) * 0.6931472) -
              *norm) * 1.442695;
      fVar12 = ((auVar10._4_4_ +
                (auVar17._4_4_ +
                fVar19 * -1.4980303 + (float)(int)fVar22 * 1.1920929e-07 + -124.22552) * 0.6931472)
               - norm[1]) * 1.442695;
      fVar13 = ((auVar10._8_4_ +
                (auVar17._8_4_ +
                fVar24 * -1.4980303 + (float)(int)fVar23 * 1.1920929e-07 + -124.22552) * 0.6931472)
               - norm[2]) * 1.442695;
      fVar14 = ((auVar10._12_4_ +
                (auVar17._12_4_ +
                fVar26 * -1.4980303 + (float)(int)fVar25 * 1.1920929e-07 + -124.22552) * 0.6931472)
               - norm[3]) * 1.442695;
      fVar20 = (float)(~-(uint)(fVar8 < -126.0) & (uint)(fVar8 + 0.0) |
                      -(uint)(fVar8 < -126.0) & 0xc2fc0000);
      fVar18 = (float)(~-(uint)(fVar12 < -126.0) & (uint)(fVar12 + 0.0) |
                      -(uint)(fVar12 < -126.0) & 0xc2fc0000);
      fVar22 = (float)(~-(uint)(fVar13 < -126.0) & (uint)(fVar13 + 0.0) |
                      -(uint)(fVar13 < -126.0) & 0xc2fc0000);
      fVar19 = (float)(~-(uint)(fVar14 < -126.0) & (uint)(fVar14 + 0.0) |
                      -(uint)(fVar14 < -126.0) & 0xc2fc0000);
      fVar8 = (fVar20 - (float)(int)fVar20) + (float)(-(uint)(fVar8 < 0.0) & 0x3f800000);
      fVar12 = (fVar18 - (float)(int)fVar18) + (float)(-(uint)(fVar12 < 0.0) & 0x3f800000);
      fVar13 = (fVar22 - (float)(int)fVar22) + (float)(-(uint)(fVar13 < 0.0) & 0x3f800000);
      fVar14 = (fVar19 - (float)(int)fVar19) + (float)(-(uint)(fVar14 < 0.0) & 0x3f800000);
      auVar17._0_4_ = 4.8425255 - fVar8;
      auVar17._4_4_ = 4.8425255 - fVar12;
      auVar17._8_4_ = 4.8425255 - fVar13;
      auVar17._12_4_ = 4.8425255 - fVar14;
      auVar10 = divps(auVar6,auVar17);
      auVar11._0_4_ = (int)((fVar8 * -1.4901291 + auVar10._0_4_ + fVar20 + 121.274086) * 8388608.0);
      auVar11._4_4_ = (int)((fVar12 * -1.4901291 + auVar10._4_4_ + fVar18 + 121.274086) * 8388608.0)
      ;
      auVar11._8_4_ = (int)((fVar13 * -1.4901291 + auVar10._8_4_ + fVar22 + 121.274086) * 8388608.0)
      ;
      auVar11._12_4_ =
           (int)((fVar14 * -1.4901291 + auVar10._12_4_ + fVar19 + 121.274086) * 8388608.0);
      auVar16._4_4_ = underflow_threshold;
      auVar16._0_4_ = underflow_threshold;
      auVar16._8_4_ = underflow_threshold;
      auVar16._12_4_ = underflow_threshold;
      auVar10 = maxps(auVar16,auVar11);
      *pauVar3 = auVar10;
      norm = norm + 4;
      pauVar1 = pauVar3 + 1;
      pauVar4 = pauVar3 + 2;
      pauVar3 = pauVar1;
    } while (pauVar4 < pauVar2);
  }
  for (; pauVar1 < pauVar2; pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + 4)) {
    fVar8 = *(float *)*pauVar1;
    fVar13 = fVar8 + 2.0;
    fVar12 = (float)((uint)fVar13 & 0x7fffff | 0x3f000000);
    auVar5._4_12_ = DAT_002814b0._4_12_;
    auVar5._0_4_ = fVar8 * 6.0 + 13.0;
    auVar7._0_4_ = fVar13 * 12.0 * fVar13;
    auVar7._4_4_ = fVar12 + 0.35208872;
    auVar7._8_8_ = 0;
    auVar6 = divps(auVar5,auVar7);
    fVar12 = ((((fVar12 * -1.4980303 + (float)(uint)fVar13 * 1.1920929e-07 + -124.22545) -
               auVar6._4_4_) * 0.6931472 +
              (-(fVar8 + fVar8 + 1.0) / ((fVar8 + 1.0) * fVar8) - auVar6._0_4_)) - *norm) * 1.442695
    ;
    fVar8 = -126.0;
    if (-126.0 <= fVar12) {
      fVar8 = fVar12;
    }
    fVar12 = (fVar8 - (float)(int)fVar8) + (float)(-(uint)(fVar12 < 0.0) & 0x3f800000);
    fVar12 = (float)(long)((fVar12 * -1.4901291 +
                           27.728024 / (4.8425255 - fVar12) + fVar8 + 121.274086) * 8388608.0);
    fVar8 = fVar12;
    if (fVar12 <= underflow_threshold) {
      fVar8 = underflow_threshold;
    }
    *(uint *)*pauVar1 =
         ~-(uint)NAN(underflow_threshold) & (uint)fVar8 |
         -(uint)NAN(underflow_threshold) & (uint)fVar12;
    norm = norm + 1;
  }
  return;
}

Assistant:

void vexpdigammify_2(vw &all, float *gamma, const float *norm, const float underflow_threshold)
{
  float *fp = gamma;
  const float *np;
  const float *fpend = gamma + all.lda;

  for (np = norm; fp < fpend && !is_aligned16(fp); ++fp, ++np)
    *fp = fmax(underflow_threshold, fastexp(fastdigamma(*fp) - *np));

  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4, np += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    arg = vfastdigamma(arg);
    v4sf vnorm = _mm_loadu_ps(np);
    arg = arg - vnorm;
    arg = vfastexp(arg);
    arg = _mm_max_ps(v4sfl(underflow_threshold), arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp, ++np) *fp = fmax(underflow_threshold, fastexp(fastdigamma(*fp) - *np));
}